

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O1

void copyBytes(ostream *dst,istream *src,int len)

{
  int iVar1;
  char buf [512];
  undefined1 local_238 [520];
  
  if (0 < len) {
    iVar1 = 0;
    do {
      std::istream::read((char *)src,(long)local_238);
      std::ostream::write((char *)dst,(long)local_238);
      iVar1 = iVar1 + 0x200;
    } while (iVar1 < len);
  }
  return;
}

Assistant:

void copyBytes(std::ostream& dst, std::istream& src, int len) {
	constexpr int BUFLEN = 512;
	char buf[BUFLEN];
	for (int i = 0; i < len; i += BUFLEN) {
		int amt = std::min(len - i, BUFLEN);
		src.read(buf, amt);
		dst.write(buf, amt);
	}
}